

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

Message * __thiscall
google::protobuf::Reflection::ReleaseMessage
          (Reflection *this,Message *message,FieldDescriptor *field,MessageFactory *factory)

{
  int iVar1;
  Message *pMVar2;
  Arena *pAVar3;
  undefined4 extraout_var;
  MessageFactory *in_RCX;
  FieldDescriptor *in_RDX;
  Message *in_RSI;
  Reflection *in_RDI;
  Message *copy_from_arena;
  Message *released;
  Reflection *in_stack_ffffffffffffffd0;
  Message *local_28;
  
  pMVar2 = UnsafeArenaReleaseMessage(in_RDI,in_RSI,in_RDX,in_RCX);
  pAVar3 = GetArena(in_stack_ffffffffffffffd0,(Message *)in_RDI);
  local_28 = pMVar2;
  if ((pAVar3 != (Arena *)0x0) && (pMVar2 != (Message *)0x0)) {
    iVar1 = (*(pMVar2->super_MessageLite)._vptr_MessageLite[3])();
    local_28 = (Message *)CONCAT44(extraout_var,iVar1);
    (*(local_28->super_MessageLite)._vptr_MessageLite[0x10])(local_28,pMVar2);
  }
  return local_28;
}

Assistant:

Message* Reflection::ReleaseMessage(Message* message,
                                    const FieldDescriptor* field,
                                    MessageFactory* factory) const {
  Message* released = UnsafeArenaReleaseMessage(message, field, factory);
  if (GetArena(message) != nullptr && released != nullptr) {
    Message* copy_from_arena = released->New();
    copy_from_arena->CopyFrom(*released);
    released = copy_from_arena;
  }
  return released;
}